

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

double norm2(double *array,int N)

{
  double dVar1;
  double local_20;
  double nrm;
  int i;
  int N_local;
  double *array_local;
  
  local_20 = 0.0;
  for (nrm._0_4_ = 0; nrm._0_4_ < N; nrm._0_4_ = nrm._0_4_ + 1) {
    local_20 = array[nrm._0_4_] * array[nrm._0_4_] + local_20;
  }
  dVar1 = sqrt(local_20);
  return dVar1;
}

Assistant:

double norm2(double *array, int N) {
	int i;
	double nrm;
	
	nrm = 0.0;
	for (i = 0; i < N; ++i) {
		nrm += array[i]*array[i];
	}
	nrm = sqrt(nrm);
	return nrm;
}